

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool_regress.c
# Opt level: O0

int cancel(int argc,char **argv)

{
  longlong lVar1;
  zip_int64_t percent;
  char **argv_local;
  int argc_local;
  
  lVar1 = strtoll(*argv,(char **)0x0,10);
  if ((lVar1 < 0x65) && (-1 < lVar1)) {
    progress_userdata.limit = (double)lVar1 / 100.0;
    zip_register_cancel_callback_with_state(za,cancel_callback,0);
    print_progress(argc,argv);
    argv_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"invalid percentage \'%ld\' for cancel (valid: 0 <= x <= 100)\n",lVar1);
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

static int
cancel(int argc, char *argv[]) {
    zip_int64_t percent;
    percent = strtoll(argv[0], NULL, 10);
    if (percent > 100 || percent < 0) {
	fprintf(stderr, "invalid percentage '%" PRId64 "' for cancel (valid: 0 <= x <= 100)\n", percent);
	return -1;
    }
    progress_userdata.limit = ((double)percent)/100;

    zip_register_cancel_callback_with_state(za, cancel_callback, NULL, NULL);

    /* needs the percentage updates from print_progress */
    print_progress(argc, argv);
    return 0;
}